

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

Vector3f pbrt::EqualAreaSquareToSphere(Point2f *p)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  float fVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint dst;
  undefined1 auVar13 [16];
  Vector3f VVar14;
  
  fVar1 = (p->super_Tuple2<pbrt::Point2,_float>).x;
  if ((((0.0 <= fVar1) && (fVar1 <= 1.0)) &&
      (fVar10 = (p->super_Tuple2<pbrt::Point2,_float>).y, 0.0 <= fVar10)) && (fVar10 <= 1.0)) {
    auVar9 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar10),0x10);
    auVar12._8_4_ = 0x40000000;
    auVar12._0_8_ = 0x4000000040000000;
    auVar12._12_4_ = 0x40000000;
    auVar8._8_4_ = 0xbf800000;
    auVar8._0_8_ = 0xbf800000bf800000;
    auVar8._12_4_ = 0xbf800000;
    auVar7 = vfmadd213ps_avx512vl(auVar12,auVar9,auVar8);
    auVar11._8_4_ = 0x7fffffff;
    auVar11._0_8_ = 0x7fffffff7fffffff;
    auVar11._12_4_ = 0x7fffffff;
    auVar9 = vandps_avx(auVar7,auVar11);
    auVar12 = vshufps_avx(auVar9,auVar9,0xf5);
    auVar13 = ZEXT416((uint)(1.0 - (auVar9._0_4_ + auVar12._0_4_)));
    auVar8 = vandps_avx(auVar13,auVar11);
    fVar1 = 1.0 - auVar8._0_4_;
    auVar11 = ZEXT816(0) << 0x40;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar11,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    auVar8 = ZEXT416((uint)bVar4 * 0x3f800000 +
                     (uint)!bVar4 * (int)((auVar12._0_4_ - auVar9._0_4_) / fVar1 + 1.0));
    iVar6 = vmovmskps_avx(auVar13);
    VVar14.super_Tuple3<pbrt::Vector3,_float>.z =
         (float)((uint)(1.0 - fVar1 * fVar1) ^ iVar6 << 0x1f);
    auVar9 = vmaxss_avx(ZEXT416((uint)(2.0 - fVar1 * fVar1)),auVar11);
    if (auVar9._0_4_ < 0.0) {
      fVar10 = sqrtf(auVar9._0_4_);
      auVar11 = ZEXT816(0) << 0x40;
    }
    else {
      auVar9 = vsqrtss_avx(auVar9,auVar9);
      fVar10 = auVar9._0_4_;
    }
    auVar9 = vminss_avx(SUB6416(ZEXT464(0x40000000),0),auVar8);
    uVar3 = vcmpss_avx512f(auVar8,auVar11,1);
    fVar5 = (float)((uint)!(bool)((byte)uVar3 & 1) * auVar9._0_4_);
    fVar2 = fVar5 * fVar5;
    auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb99c6ea9),0),ZEXT416((uint)fVar2),ZEXT416(0x3c815232)
                            );
    auVar9 = vfmadd213ss_fma(auVar9,ZEXT416((uint)fVar2),ZEXT416(0xbe9de2d2));
    auVar12 = ZEXT416((uint)fVar2);
    auVar9 = vfmadd213ss_fma(auVar9,auVar12,ZEXT416(0x3f7fff90));
    auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb80f3abb),0),auVar12,ZEXT416(0x3b22d13d));
    auVar8 = vfmadd213ss_fma(auVar8,auVar12,ZEXT416(0xbda55b67));
    auVar8 = vfmadd213ss_fma(auVar8,auVar12,ZEXT416(0x3f490fd1));
    auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)(fVar5 * auVar8._0_4_)),0x10);
    auVar13._8_4_ = 0x80000000;
    auVar13._0_8_ = 0x8000000080000000;
    auVar13._12_4_ = 0x80000000;
    auVar9 = vpternlogd_avx512vl(auVar9,auVar7,auVar13,0x78);
    VVar14.super_Tuple3<pbrt::Vector3,_float>.x = fVar1 * fVar10 * auVar9._0_4_;
    VVar14.super_Tuple3<pbrt::Vector3,_float>.y = fVar1 * fVar10 * auVar9._4_4_;
    return (Vector3f)VVar14.super_Tuple3<pbrt::Vector3,_float>;
  }
  LogFatal<char_const(&)[45]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math.cpp"
             ,0x148,"Check failed: %s",(char (*) [45])"p.x >= 0 && p.x <= 1 && p.y >= 0 && p.y <= 1"
            );
}

Assistant:

Vector3f EqualAreaSquareToSphere(const Point2f &p) {
    CHECK(p.x >= 0 && p.x <= 1 && p.y >= 0 && p.y <= 1);

    // Transform p from [0,1] to [-1,1]
    Float u = 2 * p.x - 1, v = 2 * p.y - 1;

    // Take the absolute values to move u,v to the first quadrant
    Float au = std::abs(u), av = std::abs(v);

    // Compute the radius based on the signed distance along the diagonal
    Float sd = 1 - (au + av);
    Float d = std::abs(sd);
    Float r = 1 - d;

    // Compute phi*2/pi based on u, v and r (avoid div-by-zero if r=0)
    Float phi = r == 0 ? 1 : (av - au) / r + 1;  // phi = [0,2)

    // Compute the z coordinate (flip sign based on signed distance)
    Float r2 = r * r;
    Float z = 1 - r2;

    // Return a float with a's magnitude, but negated if b is negative.
    auto FlipSign = [](Float a, Float b) {
        return BitsToFloat(FloatToBits(a) ^ SignBit(b));
    };
    z = FlipSign(z, sd);
    Float sinTheta = r * SafeSqrt(2 - r2);

    // Flip signs of sin/cos based on signs of u,v
    Float cosPhi = FlipSign(ApproxCos(phi), u);
    Float sinPhi = FlipSign(ApproxSin(phi), v);

    return {sinTheta * cosPhi, sinTheta * sinPhi, z};
}